

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O0

void mh_assoc_resize(mh_assoc_t *h,void *arg)

{
  mh_assoc_t *h_00;
  mh_int_t mVar1;
  mh_int_t n;
  mh_int_t local_24;
  mh_int_t i;
  mh_int_t batch;
  mh_assoc_t *s;
  void *arg_local;
  mh_assoc_t *h_local;
  
  h_00 = h->shadow;
  n = h->resize_position;
  local_24 = h->batch;
  while( true ) {
    if (h->n_buckets <= n) {
      tnt_mem_free(h->p);
      tnt_mem_free(h->b);
      h_00->size = h->size;
      memcpy(h,h_00,0x38);
      h->resize_cnt = h->resize_cnt + 1;
      return;
    }
    if (local_24 == 0) break;
    if ((h->b[n >> 4] & 1 << ((byte)n & 0xf)) != 0) {
      mVar1 = mh_assoc_put_slot(h_00,h->p + n,arg);
      h_00->p[mVar1] = h->p[n];
      h_00->b[mVar1 >> 4] = 1 << ((byte)mVar1 & 0xf) | h_00->b[mVar1 >> 4];
      h_00->n_dirty = h_00->n_dirty + 1;
    }
    n = n + 1;
    local_24 = local_24 - 1;
  }
  h->resize_position = n;
  return;
}

Assistant:

void
_mh(resize)(struct _mh(t) *h,
	    mh_arg_t arg)
{
	struct _mh(t) *s = h->shadow;
#if MH_INCREMENTAL_RESIZE
	mh_int_t  batch = h->batch;
#endif
	mh_int_t i = 0;
	for (i = h->resize_position; i < h->n_buckets; i++) {
#if MH_INCREMENTAL_RESIZE
		if (batch-- == 0) {
			h->resize_position = i;
			return;
		}
#endif
		if (!mh_exist(h, i))
			continue;
		mh_int_t n = put_slot(s, mh_node(h, i), arg);
		s->p[n] = h->p[i];
		mh_setexist(s, n);
		s->n_dirty++;
	}
	MH_FREE(h->p);
	MH_FREE(h->b);
	s->size = h->size;
	memcpy(h, s, sizeof(*h));
	h->resize_cnt++;
}